

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O2

void __thiscall WebServer::handleConnection(WebServer *this)

{
  TimerManager *this_00;
  element_type *this_01;
  int iVar1;
  __shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2> *this_02;
  ostream *poVar2;
  epoll_event *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<ClientSocket> sVar3;
  shared_ptr<ClientSocket> clientSocket_ptr;
  shared_ptr<HttpData> httpData;
  shared_ptr<TimerNode> timerNode;
  epoll_event event;
  __shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2> local_78;
  CbTask cbtask;
  
  sVar3 = std::make_shared<ClientSocket>();
  __addr = sVar3.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  while( true ) {
    iVar1 = ServerSocket::accept
                      (&this->serverSocket_,
                       (int)clientSocket_ptr.
                            super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (sockaddr *)__addr._M_pi,&in_RCX->events);
    if (iVar1 < 1) break;
    setNonBlocking((clientSocket_ptr.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->fd_);
    std::make_shared<HttpData>();
    this_01 = httpData.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_78,
               &clientSocket_ptr.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>);
    HttpData::setClientSocket(this_01,(shared_ptr<ClientSocket> *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    cbtask.arg.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    cbtask.arg.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cbtask.function.super__Function_base._M_manager = (_Manager_type)0x0;
    cbtask.function._M_invoker = (_Invoker_type)0x0;
    cbtask.function.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    cbtask.function.super__Function_base._M_functor._8_8_ = 0;
    timerNode.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)cbfunc;
    timerNode.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::function<void(std::shared_ptr<void>)>::operator=
              ((function<void(std::shared_ptr<void>)> *)&cbtask,
               (_Bind<void_(WebServer::*(WebServer_*,_std::_Placeholder<1>))(std::shared_ptr<void>)>
                *)&timerNode);
    std::__shared_ptr<void,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&cbtask.arg,
               &httpData.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>);
    std::make_shared<TimerNode,unsigned_long&,CbTask&>
              ((unsigned_long *)&timerNode,(CbTask *)&TimerNode::DEFAULT_INTERVAL_SEC);
    this_02 = &std::__detail::
               _Map_base<int,_std::pair<const_int,_std::shared_ptr<HttpData>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<HttpData>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<HttpData>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<HttpData>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->httpDataMap_,
                            &(((httpData.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->sharedPtr_clientSocket).
                              super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             fd_)->super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_02,&httpData.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>);
    event.events = Epoll::DEFAULT_EVENT;
    event.data.fd =
         (clientSocket_ptr.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->fd_
    ;
    in_RCX = &event;
    iVar1 = Epoll::modFd(this->epoll_,1,
                         (clientSocket_ptr.
                          super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->fd_,
                         in_RCX);
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"add listen socket success");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    this_00 = this->timerManager;
    std::__shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,(__shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2> *)&timerNode);
    TimerManager::addTimerNode(this_00,(shared_ptr<TimerNode> *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&timerNode.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    CbTask::~CbTask(&cbtask);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&httpData.super___shared_ptr<HttpData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    __addr._M_pi = extraout_RDX;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&clientSocket_ptr.super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void WebServer::handleConnection()
{
    /*因为ET模式，记得把socket设置为非阻塞的*/
    std::shared_ptr<ClientSocket> clientSocket_ptr = std::make_shared<ClientSocket>();
    while (serverSocket_.accept(*clientSocket_ptr) > 0)
    {
        /* 设置为非阻塞 */
        setNonBlocking(clientSocket_ptr->fd_); 

        /* 初始化httpData */
        std::shared_ptr<HttpData> httpData = std::make_shared<HttpData>();
        httpData->setClientSocket(clientSocket_ptr);
        /* 初始化timerNode */
        CbTask cbtask;
        cbtask.function = std::bind(&WebServer::cbfunc, this, std::placeholders::_1);
        cbtask.arg = httpData;
        std::shared_ptr<TimerNode> timerNode = std::make_shared<TimerNode>(TimerNode::DEFAULT_INTERVAL_SEC,cbtask);

        /* 将httpData 保存到Map中 */
        this->httpDataMap_[httpData->sharedPtr_clientSocket->fd_] = httpData;

        /* 添加对应的监听事件 */
        struct epoll_event event;
        event.events = Epoll::DEFAULT_EVENT;
        event.data.fd = clientSocket_ptr->fd_;

        if (epoll_->modFd(EPOLL_CTL_ADD, clientSocket_ptr->fd_, &event))
        {

            // std::cout << "add listen socket " << clientSocket_ptr->fd_ << std::endl;
        }
        else
        {
            std::cout << "add listen socket success" << std::endl;
        }

        /* 添加定时器 */
        timerManager->addTimerNode(timerNode);
    }
}